

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_application_info
          (Impl *this,VkApplicationInfo *app_info,ScratchAllocator *alloc,
          VkApplicationInfo **out_app_info)

{
  char *pcVar1;
  void *pvVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  VkStructureType VVar7;
  undefined4 uVar8;
  VkApplicationInfo *pVVar9;
  size_t sVar10;
  char *pcVar11;
  ptrdiff_t _Num;
  size_t sVar12;
  
  pVVar9 = (VkApplicationInfo *)ScratchAllocator::allocate_raw(alloc,0x30,0x10);
  if (pVVar9 != (VkApplicationInfo *)0x0) {
    VVar7 = app_info->sType;
    uVar8 = *(undefined4 *)&app_info->field_0x4;
    pvVar2 = app_info->pNext;
    pcVar1 = app_info->pApplicationName;
    uVar5 = app_info->applicationVersion;
    uVar6 = *(undefined4 *)&app_info->field_0x1c;
    uVar3 = app_info->engineVersion;
    uVar4 = app_info->apiVersion;
    pVVar9->pEngineName = app_info->pEngineName;
    pVVar9->engineVersion = uVar3;
    pVVar9->apiVersion = uVar4;
    pVVar9->pApplicationName = pcVar1;
    pVVar9->applicationVersion = uVar5;
    *(undefined4 *)&pVVar9->field_0x1c = uVar6;
    pVVar9->sType = VVar7;
    *(undefined4 *)&pVVar9->field_0x4 = uVar8;
    pVVar9->pNext = pvVar2;
  }
  pcVar1 = pVVar9->pEngineName;
  if (pcVar1 != (char *)0x0) {
    sVar10 = strlen(pcVar1);
    sVar12 = sVar10 + 1;
    if (sVar12 == 0) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = (char *)ScratchAllocator::allocate_raw(alloc,sVar12,0x10);
      if (pcVar11 != (char *)0x0) {
        memmove(pcVar11,pcVar1,sVar12);
      }
    }
    pVVar9->pEngineName = pcVar11;
  }
  pcVar1 = pVVar9->pApplicationName;
  if (pcVar1 != (char *)0x0) {
    sVar10 = strlen(pcVar1);
    sVar12 = sVar10 + 1;
    if (sVar12 == 0) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = (char *)ScratchAllocator::allocate_raw(alloc,sVar12,0x10);
      if (pcVar11 != (char *)0x0) {
        memmove(pcVar11,pcVar1,sVar12);
      }
    }
    pVVar9->pApplicationName = pcVar11;
  }
  *out_app_info = pVVar9;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_application_info(const VkApplicationInfo *app_info, ScratchAllocator &alloc,
                                                VkApplicationInfo **out_app_info)
{
	auto *app = copy(app_info, 1, alloc);
	if (app->pEngineName)
		app->pEngineName = copy(app->pEngineName, strlen(app->pEngineName) + 1, alloc);
	if (app->pApplicationName)
		app->pApplicationName = copy(app->pApplicationName, strlen(app->pApplicationName) + 1, alloc);

	*out_app_info = app;
	return true;
}